

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_write_sample_fixed(void *_r,int s,uchar depth)

{
  float fVar1;
  int iVar2;
  char in_DL;
  int in_ESI;
  resampler *in_RDI;
  double s32;
  resampler *r;
  
  if (in_RDI->delay_added < '\0') {
    in_RDI->delay_added = '\0';
    iVar2 = resampler_input_delay(in_RDI);
    in_RDI->write_filled = iVar2;
  }
  if (in_RDI->write_filled < 0x40) {
    fVar1 = (float)in_ESI / (float)(1 << (in_DL - 1U & 0x1f));
    in_RDI->buffer_in[in_RDI->write_pos] = fVar1;
    in_RDI->buffer_in[in_RDI->write_pos + 0x40] = fVar1;
    in_RDI->write_filled = in_RDI->write_filled + 1;
    in_RDI->write_pos = (in_RDI->write_pos + 1) % 0x40;
  }
  return;
}

Assistant:

void resampler_write_sample_fixed(void *_r, int s, unsigned char depth)
{
    resampler * r = ( resampler * ) _r;
    
    if ( r->delay_added < 0 )
    {
        r->delay_added = 0;
        r->write_filled = resampler_input_delay( r );
    }
    
    if ( r->write_filled < resampler_buffer_size )
    {
        double s32 = s;
        s32 /= (double)(1 << (depth - 1));
        
        r->buffer_in[ r->write_pos ] = (float)s32;
        r->buffer_in[ r->write_pos + resampler_buffer_size ] = (float)s32;
        
        ++r->write_filled;
        
        r->write_pos = ( r->write_pos + 1 ) % resampler_buffer_size;
    }
}